

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMaterial.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::Video::Video(Video *this,uint64_t id,Element *element,Document *doc,string *name)

{
  string *doc_00;
  bool bVar1;
  Scope *pSVar2;
  Element *pEVar3;
  Token *pTVar4;
  TokenList *pTVar5;
  char *pcVar6;
  char *pcVar7;
  uint8_t *puVar8;
  size_t sVar9;
  Token *t;
  Token *t_00;
  Token *t_01;
  allocator<char> local_4a1;
  string local_4a0;
  shared_ptr<const_Assimp::FBX::PropertyTable> local_480 [27];
  runtime_error *runtimeError;
  uint32_t len;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  char *local_250;
  char *base64data_1;
  size_t tokenLength_1;
  Token *dataToken_1;
  size_type sStack_230;
  uint32_t tokenIdx_1;
  size_t dst_offset;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  size_t local_1d8;
  size_t outLength;
  char *base64data;
  size_t tokenLength;
  Token *dataToken;
  size_type sStack_1b0;
  uint32_t tokenIdx;
  size_type numTokens;
  size_t targetLength;
  string local_198;
  char *local_178;
  char *data;
  Token *token;
  string local_148;
  string local_128;
  allocator<char> local_101;
  string local_100;
  Element *local_e0;
  Element *Content;
  string local_d0;
  Element *local_b0;
  Element *RelativeFilename;
  string local_a0;
  Element *local_80;
  Element *FileName;
  string local_70;
  Element *local_50;
  Element *Type;
  Scope *local_38;
  Scope *sc;
  string *name_local;
  Document *doc_local;
  Element *element_local;
  uint64_t id_local;
  Video *this_local;
  
  sc = (Scope *)name;
  name_local = (string *)doc;
  doc_local = (Document *)element;
  element_local = (Element *)id;
  id_local = (uint64_t)this;
  FBX::Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Video_00faf238;
  std::__cxx11::string::string((string *)&this->type);
  std::__cxx11::string::string((string *)&this->relativeFileName);
  std::__cxx11::string::string((string *)&this->fileName);
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::shared_ptr(&this->props);
  this->contentLength = 0;
  this->content = (uint8_t *)0x0;
  pSVar2 = GetRequiredScope((Element *)doc_local);
  local_38 = pSVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Type",(allocator<char> *)((long)&FileName + 7));
  pEVar3 = Scope::operator[](pSVar2,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&FileName + 7));
  pSVar2 = local_38;
  local_50 = pEVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"FileName",(allocator<char> *)((long)&RelativeFilename + 7));
  pEVar3 = Scope::FindElementCaseInsensitive(pSVar2,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&RelativeFilename + 7));
  pSVar2 = local_38;
  local_80 = pEVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"RelativeFilename",(allocator<char> *)((long)&Content + 7));
  pEVar3 = Scope::operator[](pSVar2,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&Content + 7));
  pSVar2 = local_38;
  local_b0 = pEVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"Content",&local_101);
  pEVar3 = Scope::operator[](pSVar2,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  local_e0 = pEVar3;
  if (local_50 != (Element *)0x0) {
    pTVar4 = GetRequiredToken(local_50,0);
    ParseTokenAsString_abi_cxx11_(&local_128,(FBX *)pTVar4,t);
    std::__cxx11::string::operator=((string *)&this->type,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
  }
  if (local_80 != (Element *)0x0) {
    pTVar4 = GetRequiredToken(local_80,0);
    ParseTokenAsString_abi_cxx11_(&local_148,(FBX *)pTVar4,t_00);
    std::__cxx11::string::operator=((string *)&this->fileName,(string *)&local_148);
    std::__cxx11::string::~string((string *)&local_148);
  }
  if (local_b0 != (Element *)0x0) {
    pTVar4 = GetRequiredToken(local_b0,0);
    ParseTokenAsString_abi_cxx11_((string *)&token,(FBX *)pTVar4,t_01);
    std::__cxx11::string::operator=((string *)&this->relativeFileName,(string *)&token);
    std::__cxx11::string::~string((string *)&token);
  }
  if (local_e0 != (Element *)0x0) {
    pTVar5 = Element::Tokens(local_e0);
    bVar1 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
            empty(pTVar5);
    if (!bVar1) {
      data = (char *)GetRequiredToken(local_e0,0);
      local_178 = Token::begin((Token *)data);
      bVar1 = Token::IsBinary((Token *)data);
      if (bVar1) {
        pcVar6 = Token::end((Token *)data);
        if ((ulong)((long)pcVar6 - (long)local_178) < 5) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_298,
                     "binary data array is too short, need five (5) bytes for type signature and element count"
                     ,&local_299);
          Util::DOMError(&local_298,(Element *)doc_local);
        }
        if (*local_178 == 'R') {
          runtimeError._0_4_ = *(uint *)(local_178 + 1);
          this->contentLength = (ulong)(uint)runtimeError;
          puVar8 = (uint8_t *)operator_new__((ulong)(uint)runtimeError);
          this->content = puVar8;
          memcpy(this->content,local_178 + 5,(ulong)(uint)runtimeError);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&len,"video content is not raw binary data, ignoring",
                     (allocator<char> *)((long)&runtimeError + 7));
          Util::DOMWarning((string *)&len,(Element *)doc_local);
          std::__cxx11::string::~string((string *)&len);
          std::allocator<char>::~allocator((allocator<char> *)((long)&runtimeError + 7));
        }
      }
      else {
        if (*local_178 != '\"') {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_198,"embedded content is not surrounded by quotation marks",
                     (allocator<char> *)((long)&targetLength + 7));
          Util::DOMError(&local_198,(Element *)doc_local);
        }
        numTokens = 0;
        pTVar5 = Element::Tokens(local_e0);
        sStack_1b0 = std::
                     vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                     ::size(pTVar5);
        for (dataToken._4_4_ = 0; dataToken._4_4_ < sStack_1b0;
            dataToken._4_4_ = dataToken._4_4_ + 1) {
          tokenLength = (size_t)GetRequiredToken(local_e0,dataToken._4_4_);
          pcVar6 = Token::end((Token *)tokenLength);
          pcVar7 = Token::begin((Token *)tokenLength);
          base64data = pcVar6 + (-2 - (long)pcVar7);
          pcVar6 = Token::begin((Token *)tokenLength);
          outLength = (size_t)(pcVar6 + 1);
          local_1d8 = Util::ComputeDecodedSizeBase64((char *)outLength,(size_t)base64data);
          if (local_1d8 == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1f8,"Corrupted embedded content found",&local_1f9);
            Util::DOMError(&local_1f8,(Element *)doc_local);
          }
          numTokens = local_1d8 + numTokens;
        }
        if (numTokens == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_220,"Corrupted embedded content found",
                     (allocator<char> *)((long)&dst_offset + 7));
          Util::DOMError(&local_220,(Element *)doc_local);
        }
        puVar8 = (uint8_t *)operator_new__(numTokens);
        this->content = puVar8;
        this->contentLength = numTokens;
        sStack_230 = 0;
        for (dataToken_1._4_4_ = 0; dataToken_1._4_4_ < sStack_1b0;
            dataToken_1._4_4_ = dataToken_1._4_4_ + 1) {
          tokenLength_1 = (size_t)GetRequiredToken(local_e0,dataToken_1._4_4_);
          pcVar6 = Token::end((Token *)tokenLength_1);
          pcVar7 = Token::begin((Token *)tokenLength_1);
          base64data_1 = pcVar6 + (-2 - (long)pcVar7);
          local_250 = Token::begin((Token *)tokenLength_1);
          local_250 = local_250 + 1;
          sVar9 = Util::DecodeBase64(local_250,(size_t)base64data_1,this->content + sStack_230,
                                     numTokens - sStack_230);
          sStack_230 = sVar9 + sStack_230;
        }
        if (numTokens != sStack_230) {
          if (this->content != (uint8_t *)0x0) {
            operator_delete__(this->content);
          }
          this->contentLength = 0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_270,"Corrupted embedded content found",&local_271);
          Util::DOMError(&local_270,(Element *)doc_local);
        }
      }
    }
  }
  doc_00 = name_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a0,"Video.FbxVideo",&local_4a1);
  Util::GetPropertyTable
            ((Util *)local_480,(Document *)doc_00,&local_4a0,(Element *)doc_local,local_38,false);
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::operator=(&this->props,local_480);
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::~shared_ptr(local_480);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  return;
}

Assistant:

Video::Video(uint64_t id, const Element& element, const Document& doc, const std::string& name)
: Object(id,element,name)
, contentLength(0)
, content(0)
{
    const Scope& sc = GetRequiredScope(element);

    const Element* const Type = sc["Type"];
    const Element* const FileName = sc.FindElementCaseInsensitive("FileName");  //some files retain the information as "Filename", others "FileName", who knows
    const Element* const RelativeFilename = sc["RelativeFilename"];
    const Element* const Content = sc["Content"];

    if(Type) {
        type = ParseTokenAsString(GetRequiredToken(*Type,0));
    }

    if(FileName) {
        fileName = ParseTokenAsString(GetRequiredToken(*FileName,0));
    }

    if(RelativeFilename) {
        relativeFileName = ParseTokenAsString(GetRequiredToken(*RelativeFilename,0));
    }

    if(Content && !Content->Tokens().empty()) {
        //this field is omitted when the embedded texture is already loaded, let's ignore if it's not found
        try {
            const Token& token = GetRequiredToken(*Content, 0);
            const char* data = token.begin();
            if (!token.IsBinary()) {
                if (*data != '"') {
                    DOMError("embedded content is not surrounded by quotation marks", &element);
                }
                else {
                    size_t targetLength = 0;
                    auto numTokens = Content->Tokens().size();
                    // First time compute size (it could be large like 64Gb and it is good to allocate it once)
                    for (uint32_t tokenIdx = 0; tokenIdx < numTokens; ++tokenIdx)
                    {
                        const Token& dataToken = GetRequiredToken(*Content, tokenIdx);
                        size_t tokenLength = dataToken.end() - dataToken.begin() - 2; // ignore double quotes
                        const char* base64data = dataToken.begin() + 1;
                        const size_t outLength = Util::ComputeDecodedSizeBase64(base64data, tokenLength);
                        if (outLength == 0)
                        {
                            DOMError("Corrupted embedded content found", &element);
                        }
                        targetLength += outLength;
                    }
                    if (targetLength == 0)
                    {
                        DOMError("Corrupted embedded content found", &element);
                    }
                    content = new uint8_t[targetLength];
                    contentLength = static_cast<uint64_t>(targetLength);
                    size_t dst_offset = 0;
                    for (uint32_t tokenIdx = 0; tokenIdx < numTokens; ++tokenIdx)
                    {
                        const Token& dataToken = GetRequiredToken(*Content, tokenIdx);
                        size_t tokenLength = dataToken.end() - dataToken.begin() - 2; // ignore double quotes
                        const char* base64data = dataToken.begin() + 1;
                        dst_offset += Util::DecodeBase64(base64data, tokenLength, content + dst_offset, targetLength - dst_offset);
                    }
                    if (targetLength != dst_offset)
                    {
                        delete[] content;
                        contentLength = 0;
                        DOMError("Corrupted embedded content found", &element);
                    }
                }
            }
            else if (static_cast<size_t>(token.end() - data) < 5) {
                DOMError("binary data array is too short, need five (5) bytes for type signature and element count", &element);
            }
            else if (*data != 'R') {
                DOMWarning("video content is not raw binary data, ignoring", &element);
            }
            else {
                // read number of elements
                uint32_t len = 0;
                ::memcpy(&len, data + 1, sizeof(len));
                AI_SWAP4(len);

                contentLength = len;

                content = new uint8_t[len];
                ::memcpy(content, data + 5, len);
            }
        } catch (const runtime_error& runtimeError)
        {
            //we don't need the content data for contents that has already been loaded
            ASSIMP_LOG_DEBUG_F("Caught exception in FBXMaterial (likely because content was already loaded): ",
                    runtimeError.what());
        }
    }

    props = GetPropertyTable(doc,"Video.FbxVideo",element,sc);
}